

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall wabt::Var::set_index(Var *this,Index index)

{
  pointer pcVar1;
  
  if ((this->type_ == Name) &&
     (pcVar1 = (this->field_2).name_._M_dataplus._M_p,
     pcVar1 != (pointer)((long)&this->field_2 + 0x10))) {
    operator_delete(pcVar1);
  }
  this->type_ = Index;
  (this->field_2).index_ = index;
  return;
}

Assistant:

void Var::set_index(Index index) {
  Destroy();
  type_ = VarType::Index;
  index_ = index;
}